

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmNtk.c
# Opt level: O0

void Sfm_NtkRemoveFanin(Sfm_Ntk_t *p,int iNode,int iFanin)

{
  int iVar1;
  Vec_Int_t *pVVar2;
  int RetValue;
  int iFanin_local;
  int iNode_local;
  Sfm_Ntk_t *p_local;
  
  iVar1 = Sfm_ObjIsNode(p,iNode);
  if (iVar1 == 0) {
    __assert_fail("Sfm_ObjIsNode(p, iNode)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x10a,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
  }
  iVar1 = Sfm_ObjIsPo(p,iFanin);
  if (iVar1 != 0) {
    __assert_fail("!Sfm_ObjIsPo(p, iFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x10b,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
  }
  pVVar2 = Sfm_ObjFiArray(p,iNode);
  iVar1 = Vec_IntRemove(pVVar2,iFanin);
  if (iVar1 == 0) {
    __assert_fail("RetValue",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                  ,0x10d,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
  }
  pVVar2 = Sfm_ObjFoArray(p,iFanin);
  iVar1 = Vec_IntRemove(pVVar2,iNode);
  if (iVar1 != 0) {
    return;
  }
  __assert_fail("RetValue",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/opt/sfm/sfmNtk.c"
                ,0x10f,"void Sfm_NtkRemoveFanin(Sfm_Ntk_t *, int, int)");
}

Assistant:

void Sfm_NtkRemoveFanin( Sfm_Ntk_t * p, int iNode, int iFanin )
{
    int RetValue;
    assert( Sfm_ObjIsNode(p, iNode) );
    assert( !Sfm_ObjIsPo(p, iFanin) );
    RetValue = Vec_IntRemove( Sfm_ObjFiArray(p, iNode), iFanin );
    assert( RetValue );
    RetValue = Vec_IntRemove( Sfm_ObjFoArray(p, iFanin), iNode );
    assert( RetValue );
}